

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmDbcc<(moira::Instr)53,(moira::Mode)12,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  char cVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  
  uVar8 = *addr + 2;
  *addr = uVar8;
  iVar4 = (*this->_vptr_Moira[5])(this,(ulong)uVar8);
  pcVar6 = "dbvc";
  if (str->upper != false) {
    pcVar6 = "DBVC";
  }
  cVar5 = *pcVar6;
  while (cVar5 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar5;
    cVar5 = *pcVar6;
  }
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  cVar5 = ',';
  lVar7 = 0;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar5;
    cVar5 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  StrWriter::operator<<(str,(UInt)(uVar8 + (int)(short)iVar4));
  return;
}

Assistant:

void
Moira::dasmDbcc(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn ( _____________xxx(op) );
    auto dst = addr + 2;

    dst += (i16)dasmRead<Word>(addr);

    str << Ins<I>{} << tab << src << ", " << UInt(dst);
}